

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testlimits.c
# Opt level: O2

int main(int argc,char **argv)

{
  functest p_Var1;
  int iVar2;
  int i;
  int iVar3;
  int iVar4;
  long lVar5;
  size_t sVar6;
  uint uVar7;
  ulong uVar8;
  char *pcVar9;
  long lVar10;
  bool bVar11;
  size_t sStack_40;
  
  for (lVar5 = 0; lVar5 != 0x1000; lVar5 = lVar5 + 1) {
    filling[lVar5] = 'a';
  }
  filling[0x1000] = '\0';
  xmlMemSetup(xmlMemFree,xmlMemMalloc,xmlMemRealloc,xmlMemoryStrdup);
  xmlInitParser();
  xmlInitializeCatalog();
  xmlCatalogSetDefaults(0);
  iVar3 = xmlRegisterInputCallbacks(hugeMatch,hugeOpen,hugeRead,hugeClose);
  if (iVar3 < 0) {
    pcVar9 = "failed to register Huge handlers\n";
    sStack_40 = 0x21;
  }
  else {
    iVar3 = xmlRegisterInputCallbacks(crazyMatch,crazyOpen,crazyRead);
    if (-1 < iVar3) {
      bVar11 = false;
      for (lVar5 = 1; lVar5 < argc; lVar5 = lVar5 + 1) {
        pcVar9 = argv[lVar5];
        if (((*pcVar9 == '-') && (pcVar9[1] == 'v')) && (pcVar9[2] == '\0')) {
          verbose = '\x01';
        }
        else {
          iVar3 = strcmp(pcVar9,"-quiet");
          if (iVar3 == 0) {
            tests_quiet = '\x01';
          }
          else {
            iVar3 = strcmp(pcVar9,"-crazy");
            if (iVar3 == 0) {
              bVar11 = true;
            }
          }
        }
      }
      if (!bVar11) {
        for (lVar5 = 0; iVar2 = nb_tests, iVar3 = nb_errors, lVar5 != 2; lVar5 = lVar5 + 1) {
          if ((tests_quiet == '\0') && (testDescriptions[lVar5].desc != (char *)0x0)) {
            printf("## %s\n");
          }
          p_Var1 = testDescriptions[lVar5].func;
          for (lVar10 = 0; lVar10 != 0x120; lVar10 = lVar10 + 0x18) {
            iVar4 = 0;
            if (lVar10 != 0x18 || lVar5 != 0) {
              iVar4 = *(int *)((long)&limitDescriptions[0].fail + lVar10);
            }
            iVar4 = (*p_Var1)(*(char **)((long)&limitDescriptions[0].name + lVar10),
                              *(size_t *)((long)&limitDescriptions[0].limit + lVar10),
                              *(int *)((long)&limitDescriptions[0].options + lVar10),iVar4);
            if (iVar4 != 0) {
              nb_errors = nb_errors + 1;
            }
          }
          if (verbose == '\x01') {
            if (nb_errors == iVar3) {
              printf("Ran %d tests, no errors\n",(ulong)(uint)(nb_tests - iVar2));
            }
            else {
              printf("Ran %d tests, %d errors, %d leaks\n",(ulong)(uint)(nb_tests - iVar2));
            }
          }
        }
      }
      iVar2 = nb_tests;
      iVar3 = nb_errors;
      if (tests_quiet == '\0') {
        puts("## Crazy tests on reader");
      }
      uVar8 = 0;
      while( true ) {
        uVar7 = (uint)uVar8;
        sVar6 = strlen(crazy);
        if (sVar6 <= uVar8) break;
        iVar4 = get_crazy_fail(uVar7);
        crazy_indx = uVar7;
        iVar4 = readerTest("crazy::test",0x988680,0,iVar4);
        if (iVar4 != 0) {
          nb_errors = nb_errors + 1;
        }
        if (tests_quiet == '\0') {
          fputc((int)crazy[uVar8],_stderr);
        }
        uVar8 = (ulong)(uVar7 + 1);
      }
      if (tests_quiet == '\0') {
        puts("\n## Crazy tests on SAX");
      }
      uVar8 = 0;
      while( true ) {
        uVar7 = (uint)uVar8;
        sVar6 = strlen(crazy);
        if (sVar6 <= uVar8) break;
        iVar4 = get_crazy_fail(uVar7);
        crazy_indx = uVar7;
        iVar4 = saxTest("crazy::test",0x988680,0,iVar4);
        if (iVar4 != 0) {
          nb_errors = nb_errors + 1;
        }
        if (tests_quiet == '\0') {
          fputc((int)crazy[uVar8],_stderr);
        }
        uVar8 = (ulong)(uVar7 + 1);
      }
      if (tests_quiet == '\0') {
        fputc(10,_stderr);
      }
      if (verbose == '\x01') {
        if (nb_errors - iVar3 == 0) {
          printf("Ran %d tests, no errors\n",(ulong)(uint)(nb_tests - iVar2));
        }
        else {
          printf("Ran %d tests, %d errors, %d leaks\n",(ulong)(uint)(nb_tests - iVar2),
                 (ulong)(uint)(nb_errors - iVar3),0);
        }
      }
      bVar11 = nb_errors == 0;
      if (bVar11) {
        printf("Total %d tests, no errors\n",(ulong)(uint)nb_tests);
      }
      else {
        printf("Total %d tests, %d errors, %d leaks\n",(ulong)(uint)nb_tests,(ulong)(uint)nb_errors,
               0);
      }
      xmlCleanupParser();
      return (uint)!bVar11;
    }
    pcVar9 = "failed to register Crazy handlers\n";
    sStack_40 = 0x22;
  }
  fwrite(pcVar9,sStack_40,1,_stderr);
  exit(1);
}

Assistant:

int
main(int argc ATTRIBUTE_UNUSED, char **argv ATTRIBUTE_UNUSED) {
    int i, a, ret = 0;
    int subset = 0;

    fillFilling();
    initializeLibxml2();

    for (a = 1; a < argc;a++) {
        if (!strcmp(argv[a], "-v"))
	    verbose = 1;
        else if (!strcmp(argv[a], "-quiet"))
	    tests_quiet = 1;
        else if (!strcmp(argv[a], "-crazy"))
	    subset = 1;
    }
    if (subset == 0) {
	for (i = 0; testDescriptions[i].func != NULL; i++) {
	    ret += runtest(i);
	}
    }
    ret += runcrazy();
    if ((nb_errors == 0) && (nb_leaks == 0)) {
        ret = 0;
	printf("Total %d tests, no errors\n",
	       nb_tests);
    } else {
        ret = 1;
	printf("Total %d tests, %d errors, %d leaks\n",
	       nb_tests, nb_errors, nb_leaks);
    }
    xmlCleanupParser();

    return(ret);
}